

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

void __thiscall
HighsLinearSumBounds::updatedVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarUpper)

{
  int *piVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = oldVarUpper;
  if (this->implVarUpperSource[var] == sum) {
    pdVar3 = this->varUpper;
    dVar5 = pdVar3[var];
  }
  else {
    pdVar3 = this->varUpper;
    dVar4 = this->implVarUpper[var];
    if (dVar4 <= oldVarUpper) {
      dVar6 = dVar4;
    }
    dVar5 = pdVar3[var];
    if (dVar4 <= pdVar3[var]) {
      dVar5 = dVar4;
    }
  }
  if (0.0 < coefficient) {
    if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
      if (dVar6 < INFINITY) {
        dVar6 = dVar6 * coefficient;
        pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar4 = pHVar2[sum].hi;
        dVar7 = dVar4 - dVar6;
        pHVar2[sum].hi = dVar7;
        pHVar2[sum].lo =
             (dVar4 - (dVar6 + dVar7)) + (-dVar6 - (dVar7 - (dVar6 + dVar7))) + pHVar2[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (dVar5 < INFINITY) {
        dVar5 = dVar5 * coefficient;
        pHVar2 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar6 = pHVar2[sum].hi;
        dVar4 = dVar5 + dVar6;
        pHVar2[sum].hi = dVar4;
        pHVar2[sum].lo =
             (dVar6 - (dVar4 - dVar5)) + (dVar5 - (dVar4 - (dVar4 - dVar5))) + pHVar2[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (oldVarUpper < INFINITY) {
      dVar4 = oldVarUpper * coefficient;
      pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar2[sum].hi;
      dVar5 = dVar6 - dVar4;
      pHVar2[sum].hi = dVar5;
      pHVar2[sum].lo =
           (dVar6 - (dVar4 + dVar5)) + (-dVar4 - (dVar5 - (dVar4 + dVar5))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (INFINITY <= pdVar3[var]) {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
      return;
    }
    dVar4 = pdVar3[var] * coefficient;
    pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar6 = pHVar2[sum].hi;
    dVar5 = dVar4 + dVar6;
    pHVar2[sum].hi = dVar5;
    pHVar2[sum].lo =
         (dVar6 - (dVar5 - dVar4)) + (dVar4 - (dVar5 - (dVar5 - dVar4))) + pHVar2[sum].lo;
    return;
  }
  if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
    if (dVar6 < INFINITY) {
      dVar6 = dVar6 * coefficient;
      pHVar2 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar4 = pHVar2[sum].hi;
      dVar7 = dVar4 - dVar6;
      pHVar2[sum].hi = dVar7;
      pHVar2[sum].lo =
           (dVar4 - (dVar6 + dVar7)) + (-dVar6 - (dVar7 - (dVar6 + dVar7))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    if (dVar5 < INFINITY) {
      dVar5 = dVar5 * coefficient;
      pHVar2 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar2[sum].hi;
      dVar4 = dVar5 + dVar6;
      pHVar2[sum].hi = dVar4;
      pHVar2[sum].lo =
           (dVar6 - (dVar4 - dVar5)) + (dVar5 - (dVar4 - (dVar4 - dVar5))) + pHVar2[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + 1;
    }
  }
  if (oldVarUpper < INFINITY) {
    dVar4 = oldVarUpper * coefficient;
    pHVar2 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar6 = pHVar2[sum].hi;
    dVar5 = dVar6 - dVar4;
    pHVar2[sum].hi = dVar5;
    pHVar2[sum].lo =
         (dVar6 - (dVar4 + dVar5)) + (-dVar4 - (dVar5 - (dVar4 + dVar5))) + pHVar2[sum].lo;
  }
  else {
    piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + -1;
  }
  if (INFINITY <= pdVar3[var]) {
    piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
    return;
  }
  dVar4 = pdVar3[var] * coefficient;
  pHVar2 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar6 = pHVar2[sum].hi;
  dVar5 = dVar4 + dVar6;
  pHVar2[sum].hi = dVar5;
  pHVar2[sum].lo = (dVar6 - (dVar5 - dVar4)) + (dVar4 - (dVar5 - (dVar5 - dVar4))) + pHVar2[sum].lo;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarUpper(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarUpper) {
  double oldVUpper = implVarUpperSource[var] == sum
                         ? oldVarUpper
                         : std::min(implVarUpper[var], oldVarUpper);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;
  }
}